

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

int QuantizeBlock_C(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  short sVar1;
  uint uVar2;
  uint n_00;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  int level;
  uint32_t B;
  uint32_t iQ;
  uint32_t Q;
  uint32_t coeff;
  int sign;
  int j;
  int n;
  int last;
  int local_40;
  int local_3c;
  int local_20;
  int local_1c;
  
  local_1c = -1;
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    uVar2 = (uint)""[local_20];
    bVar3 = *(short *)(in_RDI + (long)(int)uVar2 * 2) < 0;
    if (bVar3) {
      local_40 = -(int)*(short *)(in_RDI + (long)(int)uVar2 * 2);
    }
    else {
      local_40 = (int)*(short *)(in_RDI + (long)(int)uVar2 * 2);
    }
    n_00 = local_40 + (uint)*(ushort *)(in_RDX + 0xc0 + (long)(int)uVar2 * 2);
    if (*(uint *)(in_RDX + 0x80 + (long)(int)uVar2 * 4) < n_00) {
      sVar1 = *(short *)(in_RDX + (long)(int)uVar2 * 2);
      local_3c = QUANTDIV(n_00,(uint)*(ushort *)(in_RDX + 0x20 + (long)(int)uVar2 * 2),
                          *(uint32_t *)(in_RDX + 0x40 + (long)(int)uVar2 * 4));
      if (0x7ff < local_3c) {
        local_3c = 0x7ff;
      }
      if (bVar3) {
        local_3c = -local_3c;
      }
      *(short *)(in_RDI + (long)(int)uVar2 * 2) = (short)local_3c * sVar1;
      *(short *)(in_RSI + (long)local_20 * 2) = (short)local_3c;
      if (local_3c != 0) {
        local_1c = local_20;
      }
    }
    else {
      *(undefined2 *)(in_RSI + (long)local_20 * 2) = 0;
      *(undefined2 *)(in_RDI + (long)(int)uVar2 * 2) = 0;
    }
  }
  return (int)(-1 < local_1c);
}

Assistant:

static int QuantizeBlock_C(int16_t in[16], int16_t out[16],
                           const VP8Matrix* WEBP_RESTRICT const mtx) {
  int last = -1;
  int n;
  for (n = 0; n < 16; ++n) {
    const int j = kZigzag[n];
    const int sign = (in[j] < 0);
    const uint32_t coeff = (sign ? -in[j] : in[j]) + mtx->sharpen_[j];
    if (coeff > mtx->zthresh_[j]) {
      const uint32_t Q = mtx->q_[j];
      const uint32_t iQ = mtx->iq_[j];
      const uint32_t B = mtx->bias_[j];
      int level = QUANTDIV(coeff, iQ, B);
      if (level > MAX_LEVEL) level = MAX_LEVEL;
      if (sign) level = -level;
      in[j] = level * (int)Q;
      out[n] = level;
      if (level) last = n;
    } else {
      out[n] = 0;
      in[j] = 0;
    }
  }
  return (last >= 0);
}